

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode parse_proxy(Curl_easy *data,connectdata *conn,char *proxy,curl_proxytype proxytype)

{
  char cVar1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  ushort **ppuVar5;
  ulong uVar6;
  size_t sVar7;
  proxy_info *ppVar8;
  byte bVar9;
  char *pcVar10;
  proxy_info *ppVar11;
  char *proxyuser;
  char *endp;
  char *local_60;
  connectdata *local_58;
  char *local_50;
  Curl_easy *local_48;
  proxy_info *local_40;
  char *local_38;
  
  local_60 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = conn;
  pcVar4 = strstr(proxy,"://");
  pcVar10 = proxy;
  if (pcVar4 != (char *)0x0) {
    pcVar10 = pcVar4 + 3;
    iVar2 = curl_strnequal("https",proxy,5);
    if (iVar2 == 0) {
      iVar2 = curl_strnequal("socks5h",proxy,7);
      if (iVar2 == 0) {
        iVar2 = curl_strnequal("socks5",proxy,6);
        if (iVar2 == 0) {
          iVar2 = curl_strnequal("socks4a",proxy,7);
          if (iVar2 == 0) {
            iVar2 = curl_strnequal("socks4",proxy,6);
            if ((iVar2 == 0) && (iVar2 = curl_strnequal("socks",proxy,5), iVar2 == 0)) {
              iVar2 = curl_strnequal("http:",proxy,5);
              if (iVar2 == 0) {
                Curl_failf(data,"Unsupported proxy scheme for \'%s\'",proxy);
                return CURLE_COULDNT_CONNECT;
              }
            }
            else {
              proxytype = CURLPROXY_SOCKS4;
            }
          }
          else {
            proxytype = CURLPROXY_SOCKS4A;
          }
        }
        else {
          proxytype = CURLPROXY_SOCKS5;
        }
      }
      else {
        proxytype = CURLPROXY_SOCKS5_HOSTNAME;
      }
    }
    else {
      proxytype = CURLPROXY_HTTPS;
    }
  }
  pcVar4 = strchr(pcVar10,0x40);
  if (pcVar4 != (char *)0x0) {
    CVar3 = parse_login_details(pcVar10,(long)pcVar4 - (long)pcVar10,&local_60,&local_50,
                                (char **)0x0);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    pcVar10 = pcVar4 + 1;
  }
  pcVar4 = pcVar10;
  if (*pcVar10 != '[') goto LAB_0050eaac;
  bVar9 = pcVar10[1];
  pcVar4 = pcVar10 + 1;
  pcVar10 = pcVar4;
  if (bVar9 != 0) {
    ppuVar5 = __ctype_b_loc();
    do {
      if (((((*ppuVar5)[bVar9] >> 0xc & 1) == 0) && (bVar9 != 0x2e)) && (bVar9 != 0x3a)) {
        if (bVar9 != 0x25) goto LAB_0050eda7;
        if ((byte)pcVar10[1] - 0x32 == 0) {
          iVar2 = 0x35 - (uint)(byte)pcVar10[2];
        }
        else {
          iVar2 = -((byte)pcVar10[1] - 0x32);
        }
        if (iVar2 != 0) {
          Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
        }
        bVar9 = pcVar10[1];
        pcVar10 = pcVar10 + 1;
        if (bVar9 != 0) {
          goto LAB_0050ed75;
        }
        break;
      }
      bVar9 = pcVar10[1];
      pcVar10 = pcVar10 + 1;
    } while (bVar9 != 0);
  }
  goto LAB_0050ea93;
LAB_0050eda7:
  if (bVar9 != 0x5d) goto LAB_0050ea93;
  *pcVar10 = '\0';
  pcVar10 = pcVar10 + 1;
  goto LAB_0050eaac;
  while( true ) {
    bVar9 = pcVar10[1];
    pcVar10 = pcVar10 + 1;
    if (bVar9 == 0) break;
LAB_0050ed75:
    if (((((*ppuVar5)[bVar9] & 0x1400) == 0) && (1 < bVar9 - 0x2d)) &&
       ((bVar9 != 0x5f && (bVar9 != 0x7e)))) goto LAB_0050eda7;
  }
LAB_0050ea93:
  Curl_infof(data,"Invalid IPv6 address format\n");
LAB_0050eaac:
  pcVar10 = strchr(pcVar10,0x3a);
  if (pcVar10 == (char *)0x0) {
    if (*pcVar4 == '/') {
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
    pcVar10 = strchr(pcVar4,0x2f);
    if (pcVar10 != (char *)0x0) {
      *pcVar10 = '\0';
    }
    uVar6 = (data->set).proxyport;
    if ((uVar6 == 0) && (uVar6 = 0x438, proxytype == CURLPROXY_HTTPS)) {
      uVar6 = 0x1bb;
    }
  }
  else {
    local_38 = (char *)0x0;
    *pcVar10 = '\0';
    uVar6 = strtol(pcVar10 + 1,&local_38,10);
    if (((((local_38 == (char *)0x0) || (cVar1 = *local_38, cVar1 == '\0')) || (cVar1 == '/')) ||
        (cVar1 == ' ')) && (uVar6 < 0x10000)) {
      local_58->port = uVar6;
    }
    else {
      Curl_infof(data,"No valid port number in proxy string (%s)\n",pcVar10 + 1);
    }
  }
  if (*pcVar4 == '\0') {
LAB_0050ecf3:
    (*Curl_cfree)(local_60);
    local_60 = (char *)0x0;
    (*Curl_cfree)(local_50);
    CVar3 = CURLE_OK;
  }
  else {
    ppVar8 = &local_58->socks_proxy;
    ppVar11 = &local_58->http_proxy;
    if ((proxytype & ~(CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0)) == CURLPROXY_SOCKS4) {
      ppVar11 = ppVar8;
    }
    ppVar11->proxytype = proxytype;
    local_48 = data;
    if (local_60 == (char *)0x0) {
LAB_0050ec94:
      if ((-1 < (long)uVar6) &&
         (((ppVar11->port = uVar6,
           (proxytype & ~(CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0)) == CURLPROXY_SOCKS4 ||
           (local_58->port < 0)) || ((ppVar8->host).rawalloc == (char *)0x0)))) {
        local_58->port = uVar6;
      }
      (*Curl_cfree)((ppVar11->host).rawalloc);
      (ppVar11->host).rawalloc = (char *)0x0;
      pcVar10 = (*Curl_cstrdup)(pcVar4);
      (ppVar11->host).rawalloc = pcVar10;
      (ppVar11->host).name = pcVar10;
      if (pcVar10 != (char *)0x0) goto LAB_0050ecf3;
    }
    else {
      local_40 = ppVar8;
      (*Curl_cfree)(ppVar11->user);
      ppVar11->user = (char *)0x0;
      pcVar10 = curl_easy_unescape(local_48,local_60,0,(int *)0x0);
      ppVar11->user = pcVar10;
      (*Curl_cfree)(local_60);
      local_60 = (char *)0x0;
      if (ppVar11->user == (char *)0x0) {
        (*Curl_cfree)(local_50);
      }
      else {
        (*Curl_cfree)(ppVar11->passwd);
        pcVar10 = local_50;
        ppVar11->passwd = (char *)0x0;
        if ((local_50 == (char *)0x0) || (sVar7 = strlen(local_50), 0xff < sVar7)) {
          pcVar10 = (*Curl_cstrdup)("");
        }
        else {
          pcVar10 = curl_easy_unescape(local_48,pcVar10,0,(int *)0x0);
        }
        ppVar11->passwd = pcVar10;
        (*Curl_cfree)(local_50);
        local_50 = (char *)0x0;
        if (ppVar11->passwd != (char *)0x0) {
          (local_58->bits).proxy_user_passwd = true;
          ppVar8 = local_40;
          goto LAB_0050ec94;
        }
      }
    }
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  return CVar3;
}

Assistant:

static CURLcode parse_proxy(struct Curl_easy *data,
                            struct connectdata *conn, char *proxy,
                            curl_proxytype proxytype)
{
  char *prox_portno;
  char *endofprot;

  /* We use 'proxyptr' to point to the proxy name from now on... */
  char *proxyptr;
  char *portptr;
  char *atsign;
  long port = -1;
  char *proxyuser = NULL;
  char *proxypasswd = NULL;
  bool sockstype;

  /* We do the proxy host string parsing here. We want the host name and the
   * port name. Accept a protocol:// prefix
   */

  /* Parse the protocol part if present */
  endofprot = strstr(proxy, "://");
  if(endofprot) {
    proxyptr = endofprot+3;
    if(checkprefix("https", proxy))
      proxytype = CURLPROXY_HTTPS;
    else if(checkprefix("socks5h", proxy))
      proxytype = CURLPROXY_SOCKS5_HOSTNAME;
    else if(checkprefix("socks5", proxy))
      proxytype = CURLPROXY_SOCKS5;
    else if(checkprefix("socks4a", proxy))
      proxytype = CURLPROXY_SOCKS4A;
    else if(checkprefix("socks4", proxy) || checkprefix("socks", proxy))
      proxytype = CURLPROXY_SOCKS4;
    else if(checkprefix("http:", proxy))
      ; /* leave it as HTTP or HTTP/1.0 */
    else {
      /* Any other xxx:// reject! */
      failf(data, "Unsupported proxy scheme for \'%s\'", proxy);
      return CURLE_COULDNT_CONNECT;
    }
  }
  else
    proxyptr = proxy; /* No xxx:// head: It's a HTTP proxy */

#ifndef HTTPS_PROXY_SUPPORT
  if(proxytype == CURLPROXY_HTTPS) {
    failf(data, "Unsupported proxy \'%s\'"
                ", libcurl is built without the HTTPS-proxy support.", proxy);
    return CURLE_NOT_BUILT_IN;
  }
#endif

  sockstype = proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
              proxytype == CURLPROXY_SOCKS5 ||
              proxytype == CURLPROXY_SOCKS4A ||
              proxytype == CURLPROXY_SOCKS4;

  /* Is there a username and password given in this proxy url? */
  atsign = strchr(proxyptr, '@');
  if(atsign) {
    CURLcode result =
      parse_login_details(proxyptr, atsign - proxyptr,
                              &proxyuser, &proxypasswd, NULL);
    if(result)
      return result;
    proxyptr = atsign + 1;
  }

  /* start scanning for port number at this point */
  portptr = proxyptr;

  /* detect and extract RFC6874-style IPv6-addresses */
  if(*proxyptr == '[') {
    char *ptr = ++proxyptr; /* advance beyond the initial bracket */
    while(*ptr && (ISXDIGIT(*ptr) || (*ptr == ':') || (*ptr == '.')))
      ptr++;
    if(*ptr == '%') {
      /* There might be a zone identifier */
      if(strncmp("%25", ptr, 3))
        infof(data, "Please URL encode %% as %%25, see RFC 6874.\n");
      ptr++;
      /* Allow unreserved characters as defined in RFC 3986 */
      while(*ptr && (ISALPHA(*ptr) || ISXDIGIT(*ptr) || (*ptr == '-') ||
                     (*ptr == '.') || (*ptr == '_') || (*ptr == '~')))
        ptr++;
    }
    if(*ptr == ']')
      /* yeps, it ended nicely with a bracket as well */
      *ptr++ = 0;
    else
      infof(data, "Invalid IPv6 address format\n");
    portptr = ptr;
    /* Note that if this didn't end with a bracket, we still advanced the
     * proxyptr first, but I can't see anything wrong with that as no host
     * name nor a numeric can legally start with a bracket.
     */
  }

  /* Get port number off proxy.server.com:1080 */
  prox_portno = strchr(portptr, ':');
  if(prox_portno) {
    char *endp = NULL;

    *prox_portno = 0x0; /* cut off number from host name */
    prox_portno ++;
    /* now set the local port number */
    port = strtol(prox_portno, &endp, 10);
    if((endp && *endp && (*endp != '/') && (*endp != ' ')) ||
       (port < 0) || (port > 65535)) {
      /* meant to detect for example invalid IPv6 numerical addresses without
         brackets: "2a00:fac0:a000::7:13". Accept a trailing slash only
         because we then allow "URL style" with the number followed by a
         slash, used in curl test cases already. Space is also an acceptable
         terminating symbol. */
      infof(data, "No valid port number in proxy string (%s)\n",
            prox_portno);
    }
    else
      conn->port = port;
  }
  else {
    if(proxyptr[0]=='/')
      /* If the first character in the proxy string is a slash, fail
         immediately. The following code will otherwise clear the string which
         will lead to code running as if no proxy was set! */
      return CURLE_COULDNT_RESOLVE_PROXY;

    /* without a port number after the host name, some people seem to use
       a slash so we strip everything from the first slash */
    atsign = strchr(proxyptr, '/');
    if(atsign)
      *atsign = '\0'; /* cut off path part from host name */

    if(data->set.proxyport)
      /* None given in the proxy string, then get the default one if it is
         given */
      port = data->set.proxyport;
    else {
      if(proxytype == CURLPROXY_HTTPS)
        port = CURL_DEFAULT_HTTPS_PROXY_PORT;
      else
        port = CURL_DEFAULT_PROXY_PORT;
    }
  }

  if(*proxyptr) {
    struct proxy_info *proxyinfo =
      sockstype ? &conn->socks_proxy : &conn->http_proxy;
    proxyinfo->proxytype = proxytype;

    if(proxyuser) {
      /* found user and password, rip them out.  note that we are unescaping
         them, as there is otherwise no way to have a username or password
         with reserved characters like ':' in them. */
      Curl_safefree(proxyinfo->user);
      proxyinfo->user = curl_easy_unescape(data, proxyuser, 0, NULL);
      Curl_safefree(proxyuser);

      if(!proxyinfo->user) {
        Curl_safefree(proxypasswd);
        return CURLE_OUT_OF_MEMORY;
      }

      Curl_safefree(proxyinfo->passwd);
      if(proxypasswd && strlen(proxypasswd) < MAX_CURL_PASSWORD_LENGTH)
        proxyinfo->passwd = curl_easy_unescape(data, proxypasswd, 0, NULL);
      else
        proxyinfo->passwd = strdup("");
      Curl_safefree(proxypasswd);

      if(!proxyinfo->passwd)
        return CURLE_OUT_OF_MEMORY;

      conn->bits.proxy_user_passwd = TRUE; /* enable it */
    }

    if(port >= 0) {
      proxyinfo->port = port;
      if(conn->port < 0 || sockstype || !conn->socks_proxy.host.rawalloc)
        conn->port = port;
    }

    /* now, clone the cleaned proxy host name */
    Curl_safefree(proxyinfo->host.rawalloc);
    proxyinfo->host.rawalloc = strdup(proxyptr);
    proxyinfo->host.name = proxyinfo->host.rawalloc;

    if(!proxyinfo->host.rawalloc)
      return CURLE_OUT_OF_MEMORY;
  }

  Curl_safefree(proxyuser);
  Curl_safefree(proxypasswd);

  return CURLE_OK;
}